

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

void __thiscall
helics::TimeDependencies::resetIteratingTimeRequests(TimeDependencies *this,Time requestTime)

{
  bool bVar1;
  baseType in_RSI;
  DependencyInfo *dep;
  iterator __end1;
  iterator __begin1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *__range1;
  vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_> *in_stack_ffffffffffffffc8
  ;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_20 [3];
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_8.internalTimeCode = in_RSI;
  local_20[0]._M_current =
       (DependencyInfo *)
       std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>::end
            (in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffffc8), ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
         ::operator*(local_20);
    if ((((in_stack_ffffffffffffffd0->dependency & 1U) != 0) &&
        ((in_stack_ffffffffffffffd0->super_TimeData).mTimeState == time_requested_iterative)) &&
       (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator==
                          ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffd0,
                           &local_8), bVar1)) {
      (in_stack_ffffffffffffffd0->super_TimeData).mTimeState = time_granted;
      (in_stack_ffffffffffffffd0->super_TimeData).Te.internalTimeCode = local_8.internalTimeCode;
      (in_stack_ffffffffffffffd0->super_TimeData).minDe.internalTimeCode = local_8.internalTimeCode;
    }
    __gnu_cxx::
    __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(local_20);
  }
  return;
}

Assistant:

void TimeDependencies::resetIteratingTimeRequests(helics::Time requestTime)
{
    for (auto& dep : dependencies) {
        if (dep.dependency && dep.mTimeState == TimeState::time_requested_iterative) {
            if (dep.next == requestTime) {
                dep.mTimeState = TimeState::time_granted;
                dep.Te = requestTime;
                dep.minDe = requestTime;
            }
        }
    }
}